

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::init
          (InterCallTestCase *this,EVP_PKEY_CTX *ctx)

{
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *this_00;
  undefined1 *puVar1;
  bool bVar2;
  pointer pCVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  bool *pbVar6;
  bool bVar7;
  ContextType ctxType;
  GLuint GVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  ShaderProgram *pSVar12;
  ProgramSources *pPVar13;
  TestError *pTVar14;
  NotSupportedError *this_01;
  int readNdx_2;
  int iVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  int iVar19;
  int writeNdx;
  StorageType SVar20;
  int iVar21;
  CommandUnion *pCVar22;
  int local_314;
  Context *local_2f8 [4];
  string local_2d8;
  _Base_ptr local_2b8;
  undefined1 local_2b0 [40];
  vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_> *local_288;
  ostringstream buf;
  ProgramSources local_100;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((((!bVar7) && (this->m_useAtomic != false)) && (this->m_storage == STORAGE_IMAGE)) &&
     (bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_shader_image_atomic"), !bVar7)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"Test requires GL_OES_shader_image_atomic extension",
               (allocator<char> *)&local_100);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)&buf);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_288 = &this->m_operationPrograms;
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::resize
            (local_288,
             ((long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_cmds).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x14,(value_type *)&buf);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((ulong)buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
       0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_operationResultStorages,
             ((long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_cmds).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x14,(value_type_conflict4 *)&buf);
  this_00 = &this->m_storageIDs;
  local_2b8 = &(this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar16 = 0;
  local_314 = 0;
  do {
    pCVar3 = (this->m_cmds).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar15 = (int)(((long)(this->m_cmds).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x14);
    if (iVar15 <= lVar16) {
      return iVar15;
    }
    switch(pCVar3[lVar16].type) {
    case TYPE_WRITE:
      pCVar22 = &pCVar3[lVar16].u_cmd;
      iVar9 = std::
              _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
              ::find(&this_00->_M_t,&(pCVar22->readZero).targetHandle);
      if (iVar9._M_node == local_2b8) {
        GVar8 = genStorage(this,(pCVar22->write).targetHandle);
        pmVar10 = std::
                  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                  ::operator[](this_00,&(pCVar22->readZero).targetHandle);
        *pmVar10 = GVar8;
      }
      iVar15 = pCVar3[lVar16].u_cmd.write.seed;
      bVar7 = this->m_useAtomic;
      SVar20 = this->m_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar11 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
      pcVar18 = glcts::fixed_sample_locations_values + 1;
      pcVar17 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      if (SVar20 == STORAGE_IMAGE) {
        pcVar18 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      }
      if (bVar7 == false) {
        pcVar18 = glcts::fixed_sample_locations_values + 1;
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      std::operator<<(poVar11,"layout (local_size_x = 1, local_size_y = 1) in;\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"layout(")
        ;
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=0) ");
        pcVar17 = "writeonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar18 = "image2D";
        pcVar17 = "iimage2D";
        if (this->m_formatInteger != false) {
          pcVar18 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar18);
        pcVar18 = " u_imageOut;\n";
LAB_012852e2:
        std::operator<<(poVar11,pcVar18);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "layout(binding=0, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar18 = "float";
        pcVar17 = "int";
        if (this->m_formatInteger != false) {
          pcVar18 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar18);
        poVar11 = std::operator<<(poVar11," values[];\n");
        pcVar18 = "} sb_out;\n";
        goto LAB_012852e2;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      poVar11 = std::operator<<(poVar11,"void main (void)\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n");
      poVar11 = std::operator<<(poVar11,
                                "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                               );
      std::operator<<(poVar11,"\n");
      SVar20 = this->m_storage;
      if (SVar20 == STORAGE_BUFFER) {
        for (; (int)SVar20 < this->m_perInvocationSize; SVar20 = SVar20 + STORAGE_IMAGE) {
          pcVar17 = "\t";
          if (this->m_useAtomic != false) {
            pcVar17 = "\tatomicExchange(";
          }
          std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar17);
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "sb_out.values[(groupNdx + ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,this->m_invocationGridSize * SVar20 *
                                       this->m_invocationGridSize + iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,this->m_invocationGridSize * this->m_invocationGridSize *
                                       this->m_perInvocationSize);
          std::operator<<(poVar11,"]");
          if (this->m_useAtomic == true) {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,", ");
            pcVar18 = "float";
            pcVar17 = "int";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            poVar11 = std::operator<<(poVar11,pcVar18);
            pcVar18 = "(groupNdx));\n";
          }
          else {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>," = ")
            ;
            pcVar18 = "float";
            pcVar17 = "int";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            poVar11 = std::operator<<(poVar11,pcVar18);
            pcVar18 = "(groupNdx);\n";
          }
          std::operator<<(poVar11,pcVar18);
        }
      }
      else if (SVar20 == STORAGE_IMAGE) {
        for (iVar19 = 0; iVar19 < this->m_perInvocationSize; iVar19 = iVar19 + 1) {
          pcVar18 = "\timageStore";
          if (this->m_useAtomic != false) {
            pcVar18 = "\timageAtomicExchange";
          }
          std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar18);
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "(u_imageOut, ivec2((int(gl_GlobalInvocationID.x) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize);
          poVar11 = std::operator<<(poVar11,", int(gl_GlobalInvocationID.y) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar19)
          ;
          std::operator<<(poVar11,"), ");
          if (this->m_useAtomic == true) {
            pcVar18 = "float";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      pcVar18);
            pcVar18 = "(groupNdx));\n";
          }
          else {
            pcVar18 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
            if (this->m_formatInteger != false) {
              pcVar18 = "ivec4(int(groupNdx), 0, 0, 0)";
            }
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      pcVar18);
            pcVar18 = ");\n";
          }
          std::operator<<(poVar11,pcVar18);
          iVar15 = iVar15 + 100;
        }
      }
      std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::__cxx11::stringbuf::str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar4,local_2f8[0],pcVar17);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_2b0,&local_2d8);
      pPVar13 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2b0);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar5,pPVar13);
      std::__cxx11::string::~string((string *)(local_2b0 + 8));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      glu::ProgramSources::~ProgramSources(&local_100);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Program #");
      std::ostream::operator<<
                (&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_314 + 1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
      ;
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      pSVar12);
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"could not build program",(allocator<char> *)&local_100);
        tcu::TestError::TestError(pTVar14,(string *)&buf);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      goto LAB_0128646c;
    case TYPE_READ:
      iVar15 = pCVar3[lVar16].u_cmd.write.seed;
      bVar7 = this->m_useAtomic;
      SVar20 = this->m_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar11 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
      pcVar17 = glcts::fixed_sample_locations_values + 1;
      if (SVar20 == STORAGE_IMAGE) {
        pcVar17 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      }
      if (bVar7 == false) {
        pcVar17 = glcts::fixed_sample_locations_values + 1;
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      std::operator<<(poVar11,"layout (local_size_x = 1, local_size_y = 1) in;\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"layout(")
        ;
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=1) ");
        pcVar17 = "readonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar17 = "image2D";
        if (this->m_formatInteger != false) {
          pcVar17 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        pcVar17 = " u_imageIn;\n";
LAB_01285789:
        std::operator<<(poVar11,pcVar17);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "layout(binding=1, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar17 = "float";
        if (this->m_formatInteger != false) {
          pcVar17 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11," values[];\n");
        pcVar17 = "} sb_in;\n";
        goto LAB_01285789;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "layout(binding=0, std430) buffer ResultBuffer\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\thighp int resultOk[];\n");
      poVar11 = std::operator<<(poVar11,"} sb_result;\n");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"void main (void)\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n");
      poVar11 = std::operator<<(poVar11,
                                "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                               );
      poVar11 = std::operator<<(poVar11,"\t");
      pcVar17 = "float";
      if (this->m_formatInteger != false) {
        pcVar17 = "int";
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      poVar11 = std::operator<<(poVar11," zero = ");
      pcVar18 = "0.0";
      pcVar17 = "0";
      if (this->m_formatInteger != false) {
        pcVar18 = "0";
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      poVar11 = std::operator<<(poVar11,";\n");
      poVar11 = std::operator<<(poVar11,"\tbool allOk = true;\n");
      std::operator<<(poVar11,"\n");
      SVar20 = this->m_storage;
      if (SVar20 == STORAGE_BUFFER) {
        for (; (int)SVar20 < this->m_perInvocationSize; SVar20 = SVar20 + STORAGE_IMAGE) {
          if (this->m_useAtomic == false) {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      "\tallOk = allOk && (sb_in.values[(groupNdx + ");
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                (poVar11,this->m_invocationGridSize * SVar20 *
                                         this->m_invocationGridSize + iVar15);
            poVar11 = std::operator<<(poVar11,") % ");
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                (poVar11,this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize);
            pcVar17 = "] == ";
          }
          else {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      "\tallOk = allOk && (atomicExchange(sb_in.values[(groupNdx + "
                                     );
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                (poVar11,this->m_invocationGridSize * SVar20 *
                                         this->m_invocationGridSize + iVar15);
            poVar11 = std::operator<<(poVar11,") % ");
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                (poVar11,this->m_invocationGridSize * this->m_invocationGridSize *
                                         this->m_perInvocationSize);
            pcVar17 = "], zero) == ";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(groupNdx));\n");
        }
      }
      else if (SVar20 == STORAGE_IMAGE) {
        for (iVar19 = 0; iVar19 < this->m_perInvocationSize; iVar19 = iVar19 + 1) {
          if (this->m_useAtomic == false) {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      "\tallOk = allOk && (imageLoad(u_imageIn, ivec2((gl_GlobalInvocationID.x + "
                                     );
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
            poVar11 = std::operator<<(poVar11,"u) % ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize);
            poVar11 = std::operator<<(poVar11,"u, gl_GlobalInvocationID.y + ");
            poVar11 = (ostream *)
                      std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar19);
            pcVar17 = "u)).x == ";
          }
          else {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      "\tallOk = allOk && (imageAtomicExchange(u_imageIn, ivec2((gl_GlobalInvocationID.x + "
                                     );
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
            poVar11 = std::operator<<(poVar11,"u) % ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize);
            poVar11 = std::operator<<(poVar11,"u, gl_GlobalInvocationID.y + ");
            poVar11 = (ostream *)
                      std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar19);
            pcVar17 = "u), zero) == ";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(groupNdx));\n");
          iVar15 = iVar15 + 100;
        }
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n");
      std::operator<<(poVar11,"}\n");
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::__cxx11::stringbuf::str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar4,local_2f8[0],pcVar17);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_2b0,&local_2d8);
      pPVar13 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2b0);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar5,pPVar13);
      std::__cxx11::string::~string((string *)(local_2b0 + 8));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      glu::ProgramSources::~ProgramSources(&local_100);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Program #");
      std::ostream::operator<<
                (&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_314 + 1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
      ;
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      pSVar12);
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"could not build program",(allocator<char> *)&local_100);
        tcu::TestError::TestError(pTVar14,(string *)&buf);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      break;
    default:
      goto switchD_0128433a_caseD_2;
    case TYPE_READ_MULTIPLE:
      iVar15 = pCVar3[lVar16].u_cmd.write.seed;
      iVar19 = pCVar3[lVar16].u_cmd.readMulti.seed1;
      bVar7 = this->m_useAtomic;
      SVar20 = this->m_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar11 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
      pcVar17 = glcts::fixed_sample_locations_values + 1;
      if (SVar20 == STORAGE_IMAGE) {
        pcVar17 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      }
      if (bVar7 == false) {
        pcVar17 = glcts::fixed_sample_locations_values + 1;
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      std::operator<<(poVar11,"layout (local_size_x = 1, local_size_y = 1) in;\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"layout(")
        ;
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=1) ");
        pcVar17 = "readonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar17 = "image2D";
        if (this->m_formatInteger != false) {
          pcVar17 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11," u_imageIn0;\n");
        poVar11 = std::operator<<(poVar11,"layout(");
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=2) ");
        pcVar17 = "readonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar17 = "image2D";
        if (this->m_formatInteger != false) {
          pcVar17 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        pcVar17 = " u_imageIn1;\n";
LAB_01284c5f:
        std::operator<<(poVar11,pcVar17);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "layout(binding=1, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer0\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar17 = "float";
        if (this->m_formatInteger != false) {
          pcVar17 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11," values[];\n");
        poVar11 = std::operator<<(poVar11,"} sb_in0;\n");
        poVar11 = std::operator<<(poVar11,"layout(binding=2, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer1\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar17 = "float";
        if (this->m_formatInteger != false) {
          pcVar17 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11," values[];\n");
        pcVar17 = "} sb_in1;\n";
        goto LAB_01284c5f;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "layout(binding=0, std430) buffer ResultBuffer\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\thighp int resultOk[];\n");
      poVar11 = std::operator<<(poVar11,"} sb_result;\n");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"void main (void)\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n");
      poVar11 = std::operator<<(poVar11,
                                "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                               );
      poVar11 = std::operator<<(poVar11,"\t");
      pcVar17 = "float";
      if (this->m_formatInteger != false) {
        pcVar17 = "int";
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      poVar11 = std::operator<<(poVar11," zero = ");
      pcVar18 = "0.0";
      pcVar17 = "0";
      if (this->m_formatInteger != false) {
        pcVar18 = "0";
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      poVar11 = std::operator<<(poVar11,";\n");
      poVar11 = std::operator<<(poVar11,"\tbool allOk = true;\n");
      std::operator<<(poVar11,"\n");
      if (this->m_storage == STORAGE_BUFFER) {
        for (iVar21 = 0; iVar21 < this->m_perInvocationSize; iVar21 = iVar21 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\tallOk = allOk && (");
          pbVar6 = glcts::fixed_sample_locations_values;
          if (this->m_useAtomic != false) {
            pbVar6 = (bool *)"\tatomicExchange(";
          }
          poVar11 = std::operator<<(poVar11,pbVar6 + 1);
          poVar11 = std::operator<<(poVar11,"sb_in0.values[(groupNdx + ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,this->m_invocationGridSize * iVar21 *
                                       this->m_invocationGridSize + iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,this->m_invocationGridSize * this->m_invocationGridSize *
                                       this->m_perInvocationSize);
          poVar11 = std::operator<<(poVar11,"]");
          pcVar17 = glcts::fixed_sample_locations_values + 1;
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar17 = "float";
          if (this->m_formatInteger != false) {
            pcVar17 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,"(groupNdx));\n");
          poVar11 = std::operator<<(poVar11,"\tallOk = allOk && (");
          pbVar6 = glcts::fixed_sample_locations_values;
          if (this->m_useAtomic != false) {
            pbVar6 = (bool *)"\tatomicExchange(";
          }
          poVar11 = std::operator<<(poVar11,pbVar6 + 1);
          poVar11 = std::operator<<(poVar11,"sb_in1.values[(groupNdx + ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,this->m_invocationGridSize * iVar21 *
                                       this->m_invocationGridSize + iVar19);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,this->m_invocationGridSize * this->m_invocationGridSize *
                                       this->m_perInvocationSize);
          poVar11 = std::operator<<(poVar11,"]");
          pcVar17 = glcts::fixed_sample_locations_values + 1;
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(groupNdx));\n");
        }
      }
      else if (this->m_storage == STORAGE_IMAGE) {
        for (iVar21 = 0; iVar21 < this->m_perInvocationSize; iVar21 = iVar21 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\tallOk = allOk && (");
          pcVar17 = "imageLoad";
          if (this->m_useAtomic != false) {
            pcVar17 = "imageAtomicExchange";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,"(u_imageIn0, ivec2((gl_GlobalInvocationID.x + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
          poVar11 = std::operator<<(poVar11,"u) % ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize);
          poVar11 = std::operator<<(poVar11,"u, gl_GlobalInvocationID.y + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar21)
          ;
          poVar11 = std::operator<<(poVar11,"u)");
          pcVar17 = ").x";
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar17 = "float";
          if (this->m_formatInteger != false) {
            pcVar17 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,"(groupNdx));\n");
          poVar11 = std::operator<<(poVar11,"\tallOk = allOk && (");
          pcVar17 = "imageLoad";
          if (this->m_useAtomic != false) {
            pcVar17 = "imageAtomicExchange";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,"(u_imageIn1, ivec2((gl_GlobalInvocationID.x + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
          poVar11 = std::operator<<(poVar11,"u) % ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize);
          poVar11 = std::operator<<(poVar11,"u, gl_GlobalInvocationID.y + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar21)
          ;
          poVar11 = std::operator<<(poVar11,"u)");
          pcVar17 = ").x";
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(groupNdx));\n");
          iVar19 = iVar19 + 100;
          iVar15 = iVar15 + 100;
        }
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n");
      std::operator<<(poVar11,"}\n");
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::__cxx11::stringbuf::str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar4,local_2f8[0],pcVar17);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_2b0,&local_2d8);
      pPVar13 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2b0);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar5,pPVar13);
      std::__cxx11::string::~string((string *)(local_2b0 + 8));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      glu::ProgramSources::~ProgramSources(&local_100);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Program #");
      std::ostream::operator<<
                (&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_314 + 1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
      ;
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      pSVar12);
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"could not build program",(allocator<char> *)&local_100);
        tcu::TestError::TestError(pTVar14,(string *)&buf);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      break;
    case TYPE_WRITE_INTERLEAVE:
      pCVar22 = &pCVar3[lVar16].u_cmd;
      iVar9 = std::
              _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
              ::find(&this_00->_M_t,&(pCVar22->readZero).targetHandle);
      if (iVar9._M_node == local_2b8) {
        GVar8 = genStorage(this,(pCVar22->write).targetHandle);
        pmVar10 = std::
                  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                  ::operator[](this_00,&(pCVar22->readZero).targetHandle);
        *pmVar10 = GVar8;
      }
      iVar15 = pCVar3[lVar16].u_cmd.write.seed;
      bVar7 = pCVar3[lVar16].u_cmd.writeInterleave.evenOdd;
      bVar2 = this->m_useAtomic;
      SVar20 = this->m_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar11 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
      pcVar18 = glcts::fixed_sample_locations_values + 1;
      pcVar17 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      if (SVar20 == STORAGE_IMAGE) {
        pcVar18 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      }
      if (bVar2 == false) {
        pcVar18 = glcts::fixed_sample_locations_values + 1;
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      std::operator<<(poVar11,"layout (local_size_x = 1, local_size_y = 1) in;\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"layout(")
        ;
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=0) ");
        pcVar17 = "writeonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar18 = "image2D";
        pcVar17 = "iimage2D";
        if (this->m_formatInteger != false) {
          pcVar18 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar18);
        pcVar18 = " u_imageOut;\n";
LAB_01285ce4:
        std::operator<<(poVar11,pcVar18);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "layout(binding=0, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar18 = "float";
        pcVar17 = "int";
        if (this->m_formatInteger != false) {
          pcVar18 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar18);
        poVar11 = std::operator<<(poVar11," values[];\n");
        pcVar18 = "} sb_out;\n";
        goto LAB_01285ce4;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      poVar11 = std::operator<<(poVar11,"void main (void)\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n");
      poVar11 = std::operator<<(poVar11,
                                "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                               );
      std::operator<<(poVar11,"\n");
      if (this->m_storage == STORAGE_BUFFER) {
        for (iVar19 = 0; iVar19 < this->m_perInvocationSize; iVar19 = iVar19 + 1) {
          pcVar17 = "\t";
          if (this->m_useAtomic != false) {
            pcVar17 = "\tatomicExchange(";
          }
          std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar17);
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "sb_out.values[((groupNdx + ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,(this->m_invocationGridSize * iVar19 *
                                       this->m_invocationGridSize) / 2 + iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,((this->m_invocationGridSize * this->m_invocationGridSize) /
                                       2) * this->m_perInvocationSize);
          poVar11 = std::operator<<(poVar11,") * 2 + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,(uint)(bVar7 ^ 1));
          std::operator<<(poVar11,"]");
          if (this->m_useAtomic == true) {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,", ");
            pcVar18 = "float";
            pcVar17 = "int";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            poVar11 = std::operator<<(poVar11,pcVar18);
            pcVar18 = "(groupNdx));\n";
          }
          else {
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"= ");
            pcVar18 = "float";
            pcVar17 = "int";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            poVar11 = std::operator<<(poVar11,pcVar18);
            pcVar18 = "(groupNdx);\n";
          }
          std::operator<<(poVar11,pcVar18);
        }
      }
      else if (this->m_storage == STORAGE_IMAGE) {
        for (iVar19 = 0; iVar19 < this->m_perInvocationSize; iVar19 = iVar19 + 1) {
          pcVar17 = "\timageStore";
          if (this->m_useAtomic != false) {
            pcVar17 = "\timageAtomicExchange";
          }
          std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar17);
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "(u_imageOut, ivec2(((int(gl_GlobalInvocationID.x) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          pcVar17 = (char *)0x2;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize / 2);
          poVar11 = std::operator<<(poVar11,") * 2 + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,(uint)(bVar7 ^ 1));
          poVar11 = std::operator<<(poVar11,", int(gl_GlobalInvocationID.y) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar19)
          ;
          std::operator<<(poVar11,"), ");
          if (this->m_useAtomic == true) {
            pcVar18 = "float";
            if (this->m_formatInteger != false) {
              pcVar18 = "int";
            }
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      pcVar18);
            pcVar18 = "(groupNdx));\n";
          }
          else {
            pcVar18 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
            if (this->m_formatInteger != false) {
              pcVar18 = "ivec4(int(groupNdx), 0, 0, 0)";
            }
            poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                      pcVar18);
            pcVar18 = ");\n";
          }
          std::operator<<(poVar11,pcVar18);
          iVar15 = iVar15 + 100;
        }
      }
      std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::__cxx11::stringbuf::str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar4,local_2f8[0],pcVar17);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_2b0,&local_2d8);
      pPVar13 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2b0);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar5,pPVar13);
      std::__cxx11::string::~string((string *)(local_2b0 + 8));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      glu::ProgramSources::~ProgramSources(&local_100);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Program #");
      std::ostream::operator<<
                (&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_314 + 1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
      ;
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      pSVar12);
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"could not build program",(allocator<char> *)&local_100);
        tcu::TestError::TestError(pTVar14,(string *)&buf);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
LAB_0128646c:
      local_314 = local_314 + 1;
      (local_288->super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>).
      _M_impl.super__Vector_impl_data._M_start[lVar16] = pSVar12;
      goto switchD_0128433a_caseD_2;
    case TYPE_READ_INTERLEAVE:
      iVar15 = pCVar3[lVar16].u_cmd.write.seed;
      iVar19 = pCVar3[lVar16].u_cmd.readMulti.targetHandle1;
      bVar7 = this->m_useAtomic;
      SVar20 = this->m_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar11 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
      pcVar17 = glcts::fixed_sample_locations_values + 1;
      if (SVar20 == STORAGE_IMAGE) {
        pcVar17 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      }
      if (bVar7 == false) {
        pcVar17 = glcts::fixed_sample_locations_values + 1;
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      std::operator<<(poVar11,"layout (local_size_x = 1, local_size_y = 1) in;\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"layout(")
        ;
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=1) ");
        pcVar17 = "readonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar17 = "image2D";
        if (this->m_formatInteger != false) {
          pcVar17 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        pcVar17 = " u_imageIn;\n";
LAB_01285f38:
        std::operator<<(poVar11,pcVar17);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "layout(binding=1, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar17 = "float";
        if (this->m_formatInteger != false) {
          pcVar17 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11," values[];\n");
        pcVar17 = "} sb_in;\n";
        goto LAB_01285f38;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "layout(binding=0, std430) buffer ResultBuffer\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\thighp int resultOk[];\n");
      poVar11 = std::operator<<(poVar11,"} sb_result;\n");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"void main (void)\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n");
      poVar11 = std::operator<<(poVar11,
                                "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                               );
      poVar11 = std::operator<<(poVar11,
                                "\tint interleavedGroupNdx = int((size.x >> 1U) * size.y * gl_GlobalInvocationID.z + (size.x >> 1U) * gl_GlobalInvocationID.y + (gl_GlobalInvocationID.x >> 1U));\n"
                               );
      poVar11 = std::operator<<(poVar11,"\t");
      pcVar17 = "float";
      if (this->m_formatInteger != false) {
        pcVar17 = "int";
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      poVar11 = std::operator<<(poVar11," zero = ");
      pcVar18 = "0.0";
      pcVar17 = "0";
      if (this->m_formatInteger != false) {
        pcVar18 = "0";
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      poVar11 = std::operator<<(poVar11,";\n");
      poVar11 = std::operator<<(poVar11,"\tbool allOk = true;\n");
      std::operator<<(poVar11,"\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "\tif (groupNdx % 2 == 0)\n");
        std::operator<<(poVar11,"\t{\n");
        for (iVar21 = 0; iVar21 < this->m_perInvocationSize; iVar21 = iVar21 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\t\tallOk = allOk && (");
          pcVar17 = "imageLoad";
          if (this->m_useAtomic != false) {
            pcVar17 = "imageAtomicExchange";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,
                                    "(u_imageIn, ivec2(((int(gl_GlobalInvocationID.x >> 1U) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize / 2);
          poVar11 = std::operator<<(poVar11,") * 2 + 0, int(gl_GlobalInvocationID.y) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar21)
          ;
          poVar11 = std::operator<<(poVar11,")");
          pcVar17 = ").x";
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(interleavedGroupNdx));\n");
          iVar15 = iVar15 + 100;
        }
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\t}\n");
        poVar11 = std::operator<<(poVar11,"\telse\n");
        std::operator<<(poVar11,"\t{\n");
        for (iVar15 = 0; iVar15 < this->m_perInvocationSize; iVar15 = iVar15 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\t\tallOk = allOk && (");
          pcVar17 = "imageLoad";
          if (this->m_useAtomic != false) {
            pcVar17 = "imageAtomicExchange";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,
                                    "(u_imageIn, ivec2(((int(gl_GlobalInvocationID.x >> 1U) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize / 2);
          poVar11 = std::operator<<(poVar11,") * 2 + 1, int(gl_GlobalInvocationID.y) + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar15)
          ;
          poVar11 = std::operator<<(poVar11,")");
          pcVar17 = ").x";
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(interleavedGroupNdx));\n");
          iVar19 = iVar19 + 100;
        }
LAB_01286e09:
        std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\t}\n");
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "\tif (groupNdx % 2 == 0)\n");
        std::operator<<(poVar11,"\t{\n");
        for (iVar21 = 0; iVar21 < this->m_perInvocationSize; iVar21 = iVar21 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\t\tallOk = allOk && (");
          pbVar6 = glcts::fixed_sample_locations_values;
          if (this->m_useAtomic != false) {
            pbVar6 = (bool *)"\tatomicExchange(";
          }
          poVar11 = std::operator<<(poVar11,pbVar6 + 1);
          poVar11 = std::operator<<(poVar11,"sb_in.values[((interleavedGroupNdx + ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,(this->m_invocationGridSize * iVar21 *
                                       this->m_invocationGridSize) / 2 + iVar15);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,(this->m_invocationGridSize * this->m_invocationGridSize *
                                       this->m_perInvocationSize) / 2);
          poVar11 = std::operator<<(poVar11,") * 2 + 0]");
          pcVar17 = glcts::fixed_sample_locations_values + 1;
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(interleavedGroupNdx));\n");
        }
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\t}\n");
        poVar11 = std::operator<<(poVar11,"\telse\n");
        std::operator<<(poVar11,"\t{\n");
        for (iVar15 = 0; iVar15 < this->m_perInvocationSize; iVar15 = iVar15 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\t\tallOk = allOk && (");
          pbVar6 = glcts::fixed_sample_locations_values;
          if (this->m_useAtomic != false) {
            pbVar6 = (bool *)"\tatomicExchange(";
          }
          poVar11 = std::operator<<(poVar11,pbVar6 + 1);
          poVar11 = std::operator<<(poVar11,"sb_in.values[((interleavedGroupNdx + ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,(this->m_invocationGridSize * iVar15 *
                                       this->m_invocationGridSize) / 2 + iVar19);
          poVar11 = std::operator<<(poVar11,") % ");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,(this->m_invocationGridSize * this->m_invocationGridSize *
                                       this->m_perInvocationSize) / 2);
          poVar11 = std::operator<<(poVar11,") * 2 + 1]");
          pcVar17 = glcts::fixed_sample_locations_values + 1;
          if (this->m_useAtomic != false) {
            pcVar17 = ", zero)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "float";
          pcVar17 = "int";
          if (this->m_formatInteger != false) {
            pcVar18 = "int";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,"(interleavedGroupNdx));\n");
        }
        goto LAB_01286e09;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n");
      std::operator<<(poVar11,"}\n");
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::__cxx11::stringbuf::str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar4,local_2f8[0],pcVar17);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_2b0,&local_2d8);
      pPVar13 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2b0);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar5,pPVar13);
      std::__cxx11::string::~string((string *)(local_2b0 + 8));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      glu::ProgramSources::~ProgramSources(&local_100);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Program #");
      std::ostream::operator<<
                (&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_314 + 1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
      ;
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      pSVar12);
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"could not build program",(allocator<char> *)&local_100);
        tcu::TestError::TestError(pTVar14,(string *)&buf);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      break;
    case TYPE_READ_ZERO:
      pCVar22 = &pCVar3[lVar16].u_cmd;
      iVar9 = std::
              _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
              ::find(&this_00->_M_t,&(pCVar22->readZero).targetHandle);
      if (iVar9._M_node == local_2b8) {
        GVar8 = genStorage(this,(pCVar22->write).targetHandle);
        pmVar10 = std::
                  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                  ::operator[](this_00,&(pCVar22->readZero).targetHandle);
        *pmVar10 = GVar8;
      }
      bVar7 = this->m_useAtomic;
      SVar20 = this->m_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar11 = std::operator<<((ostream *)&buf,"${GLSL_VERSION_DECL}\n");
      pcVar17 = glcts::fixed_sample_locations_values + 1;
      if (SVar20 == STORAGE_IMAGE) {
        pcVar17 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
      }
      if (bVar7 == false) {
        pcVar17 = glcts::fixed_sample_locations_values + 1;
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      std::operator<<(poVar11,"layout (local_size_x = 1, local_size_y = 1) in;\n");
      if (this->m_storage == STORAGE_IMAGE) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"layout(")
        ;
        pcVar17 = "r32f";
        if (this->m_formatInteger != false) {
          pcVar17 = "r32i";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,", binding=1) ");
        pcVar17 = "readonly ";
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"uniform highp ");
        pcVar17 = "image2D";
        if (this->m_formatInteger != false) {
          pcVar17 = "iimage2D";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        pcVar17 = " u_imageIn;\n";
LAB_01285038:
        std::operator<<(poVar11,pcVar17);
      }
      else if (this->m_storage == STORAGE_BUFFER) {
        poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                  "layout(binding=1, std430) ");
        pcVar17 = glcts::fixed_sample_locations_values + 1;
        if (this->m_useAtomic != false) {
          pcVar17 = "coherent ";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11,"buffer Buffer\n");
        poVar11 = std::operator<<(poVar11,"{\n");
        poVar11 = std::operator<<(poVar11,"\thighp ");
        pcVar17 = "float";
        if (this->m_formatInteger != false) {
          pcVar17 = "int";
        }
        poVar11 = std::operator<<(poVar11,pcVar17);
        poVar11 = std::operator<<(poVar11," values[];\n");
        pcVar17 = "} sb_in;\n";
        goto LAB_01285038;
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "layout(binding=0, std430) buffer ResultBuffer\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\thighp int resultOk[];\n");
      poVar11 = std::operator<<(poVar11,"} sb_result;\n");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"void main (void)\n");
      poVar11 = std::operator<<(poVar11,"{\n");
      poVar11 = std::operator<<(poVar11,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n");
      poVar11 = std::operator<<(poVar11,
                                "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                               );
      poVar11 = std::operator<<(poVar11,"\t");
      pcVar17 = "float";
      if (this->m_formatInteger != false) {
        pcVar17 = "int";
      }
      poVar11 = std::operator<<(poVar11,pcVar17);
      poVar11 = std::operator<<(poVar11," anything = ");
      pcVar18 = "5.0";
      pcVar17 = "5";
      if (this->m_formatInteger != false) {
        pcVar18 = "5";
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      poVar11 = std::operator<<(poVar11,";\n");
      poVar11 = std::operator<<(poVar11,"\tbool allOk = true;\n");
      std::operator<<(poVar11,"\n");
      if (this->m_storage == STORAGE_BUFFER) {
        for (iVar15 = 0; iVar15 < this->m_perInvocationSize; iVar15 = iVar15 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\tallOk = allOk && (");
          pbVar6 = glcts::fixed_sample_locations_values;
          if (this->m_useAtomic != false) {
            pbVar6 = (bool *)"\tatomicExchange(";
          }
          poVar11 = std::operator<<(poVar11,pbVar6 + 1);
          poVar11 = std::operator<<(poVar11,"sb_in.values[groupNdx * ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_perInvocationSize);
          poVar11 = std::operator<<(poVar11," + ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
          poVar11 = std::operator<<(poVar11,"]");
          pcVar17 = glcts::fixed_sample_locations_values + 1;
          if (this->m_useAtomic != false) {
            pcVar17 = ", anything)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "0.0";
          pcVar17 = "0";
          if (this->m_formatInteger != false) {
            pcVar18 = "0";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,");\n");
        }
      }
      else if (this->m_storage == STORAGE_IMAGE) {
        for (iVar15 = 0; iVar15 < this->m_perInvocationSize; iVar15 = iVar15 + 1) {
          poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                    "\tallOk = allOk && (");
          pcVar17 = "imageLoad";
          if (this->m_useAtomic != false) {
            pcVar17 = "imageAtomicExchange";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11,
                                    "(u_imageIn, ivec2(gl_GlobalInvocationID.x, gl_GlobalInvocationID.y + "
                                   );
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->m_invocationGridSize * iVar15)
          ;
          poVar11 = std::operator<<(poVar11,"u)");
          pcVar17 = ").x";
          if (this->m_useAtomic != false) {
            pcVar17 = ", anything)";
          }
          poVar11 = std::operator<<(poVar11,pcVar17);
          poVar11 = std::operator<<(poVar11," == ");
          pcVar18 = "0.0";
          pcVar17 = "0";
          if (this->m_formatInteger != false) {
            pcVar18 = "0";
          }
          poVar11 = std::operator<<(poVar11,pcVar18);
          std::operator<<(poVar11,");\n");
        }
      }
      poVar11 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n");
      std::operator<<(poVar11,"}\n");
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      pRVar5 = pCVar4->m_renderCtx;
      memset(&local_100,0,0xac);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      std::__cxx11::stringbuf::str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2d8,(_anonymous_namespace_ *)pCVar4,local_2f8[0],pcVar17);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_2b0,&local_2d8);
      pPVar13 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2b0);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar5,pPVar13);
      std::__cxx11::string::~string((string *)(local_2b0 + 8));
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)local_2f8);
      glu::ProgramSources::~ProgramSources(&local_100);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Program #");
      std::ostream::operator<<
                (&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_314 + 1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
      ;
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      pSVar12);
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"could not build program",(allocator<char> *)&local_100);
        tcu::TestError::TestError(pTVar14,(string *)&buf);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    local_314 = local_314 + 1;
    (this->m_operationPrograms).
    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar16] = pSVar12;
    GVar8 = genResultStorage(this);
    (this->m_operationResultStorages).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar16] = GVar8;
switchD_0128433a_caseD_2:
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

void InterCallTestCase::init (void)
{
	int			programFriendlyName = 0;
	const bool	supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// generate resources and validate command list

	m_operationPrograms.resize(m_cmds.size(), DE_NULL);
	m_operationResultStorages.resize(m_cmds.size(), 0);

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:
			{
				const op::WriteData& cmd = m_cmds[step].u_cmd.write;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ:
			{
				const op::ReadData& cmd = m_cmds[step].u_cmd.read;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program and result storage
				{
					glu::ShaderProgram* program = genReadProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_BARRIER:
			{
				break;
			}

			case InterCallOperations::Command::TYPE_READ_MULTIPLE:
			{
				const op::ReadMultipleData& cmd = m_cmds[step].u_cmd.readMulti;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle0) != m_storageIDs.end());
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle1) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadMultipleProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:
			{
				const op::WriteDataInterleaved& cmd = m_cmds[step].u_cmd.writeInterleave;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteInterleavedProgram(cmd.seed, cmd.evenOdd);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:
			{
				const op::ReadDataInterleaved& cmd = m_cmds[step].u_cmd.readInterleave;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadInterleavedProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_ZERO:
			{
				const op::ReadZeroData& cmd = m_cmds[step].u_cmd.readZero;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genReadZeroProgram();

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}